

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_ternary_expression(gravity_parser_t *parser)

{
  gnode_t *cond;
  gravity_lexer_t *lexer;
  size_t sVar1;
  gtoken_s token_00;
  gnode_t *stmt1;
  gnode_t *stmt2;
  gnode_t *pgVar2;
  gtoken_s token;
  gtoken_s end_token;
  undefined8 local_80;
  undefined4 uStack_78;
  int iStack_74;
  undefined8 local_70;
  undefined8 uStack_68;
  char *local_60;
  int local_4c;
  int local_44;
  
  cond = parser->current_node;
  if (cond == (gnode_t *)0x0) {
    pgVar2 = (gnode_t *)0x0;
  }
  else {
    lexer = parser->lexer->p[parser->lexer->n - 1];
    gravity_lexer_token(lexer);
    pgVar2 = (gnode_t *)0x0;
    stmt1 = parse_precedence(parser,PREC_LOWEST);
    if (stmt1 != (gnode_t *)0x0) {
      parse_required(parser,TOK_OP_COLON);
      pgVar2 = (gnode_t *)0x0;
      stmt2 = parse_precedence(parser,PREC_LOWEST);
      if (stmt2 != (gnode_t *)0x0) {
        gravity_lexer_token(lexer);
        sVar1 = parser->declarations->n;
        if (sVar1 == 0) {
          pgVar2 = (gnode_t *)0x0;
        }
        else {
          pgVar2 = parser->declarations->p[sVar1 - 1];
        }
        token_00.position = iStack_74;
        token_00.colno = uStack_78;
        token_00._0_8_ = local_80;
        token_00._16_8_ = local_70;
        token_00._24_8_ = uStack_68;
        token_00.value = local_60;
        pgVar2 = gnode_flow_stat_create
                           (token_00,cond,stmt1,stmt2,pgVar2,(local_44 + local_4c) - iStack_74);
      }
    }
  }
  return pgVar2;
}

Assistant:

static gnode_t *parse_ternary_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_ternary_expression");
    DECLARE_LEXER;

    // conditional expression already parsed
    gnode_t *cond = parser->current_node;
    if (!cond) return NULL;

    // '?' expression ':' expression

    // '?' already consumed
    gtoken_s token = gravity_lexer_token(lexer);

    // parse expression 1
    gnode_t *expr1 = parse_expression(parser);
    CHECK_NODE(expr1);

    parse_required(parser, TOK_OP_COLON);

    // parse expression 2
    gnode_t *expr2 = parse_expression(parser);
    CHECK_NODE(expr2);

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);

    return gnode_flow_stat_create(token, cond, expr1, expr2, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}